

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void subfrombill(obj *obj,monst *shkp)

{
  obj *obj_00;
  
  sub_one_frombill(obj,shkp);
  obj_00 = obj->cobj;
  if (obj_00 != (obj *)0x0) {
    for (; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
      if (obj_00->oclass != '\f') {
        if (obj_00->cobj == (obj *)0x0) {
          sub_one_frombill(obj_00,shkp);
        }
        else {
          subfrombill(obj_00,shkp);
        }
      }
    }
  }
  return;
}

Assistant:

void subfrombill(struct obj *obj, struct monst *shkp)
{
	struct obj *otmp;

	sub_one_frombill(obj, shkp);

	if (Has_contents(obj))
	    for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
		if (otmp->oclass == COIN_CLASS) continue;

		if (Has_contents(otmp))
		    subfrombill(otmp, shkp);
		else
		    sub_one_frombill(otmp, shkp);
	    }
}